

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unswitch_pass.cpp
# Opt level: O0

BasicBlock * __thiscall
spvtools::opt::anon_unknown_0::LoopUnswitch::CreateBasicBlock(LoopUnswitch *this,iterator ip)

{
  IRContext *pIVar1;
  uint32_t res_id;
  BasicBlock *pBVar2;
  Instruction *pIVar3;
  reference this_00;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_68;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_50;
  Uptr local_48;
  type local_40;
  BasicBlock *local_30;
  BasicBlock *bb;
  DefUseManager *def_use_mgr;
  LoopUnswitch *this_local;
  iterator ip_local;
  
  ip_local.container_ = (UptrVector *)ip.iterator_._M_current;
  this_local = (LoopUnswitch *)ip.container_;
  def_use_mgr = (DefUseManager *)this;
  bb = (BasicBlock *)IRContext::get_def_use_mgr(this->context_);
  pBVar2 = (BasicBlock *)::operator_new(0x88);
  pIVar3 = (Instruction *)::operator_new(0x70);
  pIVar1 = this->context_;
  res_id = IRContext::TakeNextId(this->context_);
  memset(&local_68,0,0x18);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector(&local_68);
  opt::Instruction::Instruction(pIVar3,pIVar1,OpLabel,0,res_id,&local_68);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&local_50,pIVar3);
  BasicBlock::BasicBlock(pBVar2,&local_50);
  std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>::
  unique_ptr<std::default_delete<spvtools::opt::BasicBlock>,void>
            ((unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>> *
             )&local_48,pBVar2);
  local_40 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::InsertBefore<false>
                       ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&this_local,
                        &local_48);
  this_00 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*(&local_40);
  std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
  ~unique_ptr(&local_48);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_50);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_68);
  local_30 = this_00;
  BasicBlock::SetParent(this_00,this->function_);
  pBVar2 = bb;
  pIVar3 = BasicBlock::GetLabelInst(local_30);
  analysis::DefUseManager::AnalyzeInstDef((DefUseManager *)pBVar2,pIVar3);
  pIVar1 = this->context_;
  pIVar3 = BasicBlock::GetLabelInst(local_30);
  IRContext::set_instr_block(pIVar1,pIVar3,local_30);
  return local_30;
}

Assistant:

BasicBlock* CreateBasicBlock(Function::iterator ip) {
    analysis::DefUseManager* def_use_mgr = context_->get_def_use_mgr();

    // TODO(1841): Handle id overflow.
    BasicBlock* bb = &*ip.InsertBefore(std::unique_ptr<BasicBlock>(
        new BasicBlock(std::unique_ptr<Instruction>(new Instruction(
            context_, spv::Op::OpLabel, 0, context_->TakeNextId(), {})))));
    bb->SetParent(function_);
    def_use_mgr->AnalyzeInstDef(bb->GetLabelInst());
    context_->set_instr_block(bb->GetLabelInst(), bb);

    return bb;
  }